

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixStep4
               (double *f0_step3,int f0_length,int threshold,double *f0_step4)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar7;
  int j;
  int i_1;
  int count;
  double coefficient;
  double tmp1;
  double tmp0;
  int distance;
  int number_of_boundaries;
  int *boundary_list;
  int i;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  int *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_1c;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    *(undefined8 *)(in_RCX + (long)local_1c * 8) = *(undefined8 *)(in_RDI + (long)local_1c * 8);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ESI;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  iVar3 = GetBoundaryList((double *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          iVar3,in_stack_ffffffffffffffc0);
  for (local_50 = 0; local_50 < iVar3 / 2 + -1; local_50 = local_50 + 1) {
    iVar4 = (*(int *)((long)pvVar6 + (long)((local_50 + 1) * 2) * 4) -
            *(int *)((long)pvVar6 + (long)(local_50 * 2 + 1) * 4)) + -1;
    if (iVar4 < in_EDX) {
      dVar7 = *(double *)(in_RDI + (long)*(int *)((long)pvVar6 + (long)(local_50 * 2 + 1) * 4) * 8)
              + 1.0;
      dVar1 = *(double *)
               (in_RDI + (long)*(int *)((long)pvVar6 + (long)((local_50 + 1) * 2) * 4) * 8);
      local_4c = 1;
      local_54 = *(int *)((long)pvVar6 + (long)(local_50 * 2 + 1) * 4);
      while (local_54 = local_54 + 1,
            local_54 <= *(int *)((long)pvVar6 + (long)((local_50 + 1) * 2) * 4) + -1) {
        *(double *)(in_RCX + (long)local_54 * 8) =
             (((dVar1 - 1.0) - dVar7) / ((double)iVar4 + 1.0)) * (double)local_4c + dVar7;
        local_4c = local_4c + 1;
      }
    }
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return;
}

Assistant:

static void FixStep4(const double *f0_step3, int f0_length, int threshold,
    double *f0_step4) {
  for (int i = 0; i < f0_length; ++i) f0_step4[i] = f0_step3[i];
  int *boundary_list = new int[f0_length];
  int number_of_boundaries =
    GetBoundaryList(f0_step3, f0_length, boundary_list);

  int distance;
  double tmp0, tmp1, coefficient;
  int count;
  for (int i = 0; i < number_of_boundaries / 2 - 1; ++i) {
    distance = boundary_list[(i + 1) * 2] - boundary_list[i * 2 + 1] - 1;
    if (distance >= threshold) continue;
    tmp0 = f0_step3[boundary_list[i * 2 + 1]] + 1;
    tmp1 = f0_step3[boundary_list[(i + 1) * 2]] - 1;
    coefficient = (tmp1 - tmp0) / (distance + 1.0);
    count = 1;
    for (int j = boundary_list[i * 2 + 1] + 1;
        j <= boundary_list[(i + 1) * 2] - 1; ++j)
      f0_step4[j] = tmp0 + coefficient * count++;
  }
  delete[] boundary_list;
}